

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O0

void __thiscall
soplex::
CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::Temp::clear(Temp *this)

{
  bool bVar1;
  long *in_RDI;
  vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  *unaff_retaddr;
  
  if (*in_RDI != 0) {
    spx_free<int*>((int **)0x34fcf3);
  }
  if (in_RDI[4] != 0) {
    spx_free<int*>((int **)0x34fd0d);
  }
  bVar1 = std::
          vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
          ::empty(unaff_retaddr);
  if (!bVar1) {
    std::
    vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
    ::clear((vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             *)0x34fd2d);
  }
  if (in_RDI[10] != 0) {
    spx_free<soplex::CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>::Pring*>
              ((Pring **)0x34fd47);
  }
  if (in_RDI[0xb] != 0) {
    spx_free<soplex::CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>::Pring*>
              ((Pring **)0x34fd61);
  }
  if (in_RDI[0xc] != 0) {
    spx_free<soplex::CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>::Pring*>
              ((Pring **)0x34fd7b);
  }
  if (in_RDI[0xd] != 0) {
    spx_free<soplex::CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>::Pring*>
              ((Pring **)0x34fd95);
  }
  return;
}

Assistant:

void CLUFactor<R>::Temp::clear()
{
   if(s_mark != nullptr)
      spx_free(s_mark);

   if(s_cact != nullptr)
      spx_free(s_cact);

   if(!s_max.empty())
      s_max.clear();

   if(pivot_col != nullptr)
      spx_free(pivot_col);

   if(pivot_colNZ != nullptr)
      spx_free(pivot_colNZ);

   if(pivot_row != nullptr)
      spx_free(pivot_row);

   if(pivot_rowNZ != nullptr)
      spx_free(pivot_rowNZ);
}